

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeDPRRegListOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  DecodeStatus DVar2;
  uint32_t local_4c;
  uint local_48;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  uint regs;
  uint Vd;
  uint i;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  Vd = 3;
  _i = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  local_3c = fieldFromInstruction_4(Val,8,5);
  local_44 = fieldFromInstruction_4(Address_local._4_4_,1,7);
  if (((local_44 == 0) || (0x10 < local_44)) || (local_40 = local_44, 0x20 < local_3c + local_44)) {
    if (0x20 < local_3c + local_44) {
      local_44 = 0x20 - local_3c;
    }
    if (local_44 == 0) {
      local_48 = 1;
    }
    else {
      local_48 = local_44;
    }
    if (local_48 < 0x10) {
      local_4c = local_48;
    }
    else {
      local_4c = 0x10;
    }
    local_40 = local_4c;
    Vd = 1;
  }
  DVar2 = DecodeDPRRegisterClass(pMStack_18,local_3c,(uint64_t)Decoder_local,_i);
  _Var1 = Check(&Vd,DVar2);
  if (_Var1) {
    for (regs = 0; regs < local_40 - 1; regs = regs + 1) {
      local_3c = local_3c + 1;
      DVar2 = DecodeDPRRegisterClass(pMStack_18,local_3c,(uint64_t)Decoder_local,_i);
      _Var1 = Check(&Vd,DVar2);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    Inst_local._4_4_ = Vd;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeDPRRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned i;
	unsigned Vd = fieldFromInstruction_4(Val, 8, 5);
	unsigned regs = fieldFromInstruction_4(Val, 1, 7);

	// In case of unpredictable encoding, tweak the operands.
	if (regs == 0 || regs > 16 || (Vd + regs) > 32) {
		regs = Vd + regs > 32 ? 32 - Vd : regs;
		regs = (1u > regs? 1u : regs);
		regs = (16u > regs? regs : 16u);
		S = MCDisassembler_SoftFail;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;

	for (i = 0; i < (regs - 1); ++i) {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, ++Vd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}